

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::plot_implicit(Plotter *this,size_t funcid)

{
  double dVar1;
  double dVar2;
  pointer pFVar3;
  pointer pdVar4;
  bool bVar5;
  _Head_base<4UL,_double,_false> _Var6;
  pointer ptVar7;
  pointer ptVar8;
  bool bVar9;
  ulong uVar10;
  allocator_type *paVar11;
  allocator_type *paVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX;
  anon_class_48_6_f4d7eaea_for__M_head_impl *__args;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_03;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_04;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_05;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_06;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_07;
  ulong uVar17;
  allocator_type *paVar18;
  int iVar19;
  size_t rel_func;
  uint uVar20;
  Expr *pEVar21;
  Expr *pEVar22;
  ulong uVar23;
  int iVar24;
  _Head_base<3UL,_int,_false> _Var25;
  _Head_base<1UL,_int,_false> _Var26;
  undefined4 uVar27;
  undefined4 uVar28;
  float in_XMM4_Da;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  interest_squares;
  anon_class_48_6_f4d7eaea_for__M_head_impl worker;
  vector<double,_std::allocator<double>_> coarse_line;
  atomic<int> sqr_id;
  color ineq_color;
  vector<std::thread,_std::allocator<std::thread>_> local_178;
  Expr *local_158;
  double local_150;
  float local_148;
  float local_144;
  int local_140;
  int local_13c;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  local_138;
  pointer local_118;
  View *local_110;
  color *local_108;
  undefined1 local_100 [8];
  undefined8 local_f8;
  undefined8 local_f0;
  pointer local_e8;
  color **local_e0;
  color *local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *local_b8;
  ulong local_b0;
  ulong local_a8;
  Environment *local_a0;
  double local_98;
  atomic<int> local_8c;
  vector<bool,_std::allocator<bool>_> local_88;
  color local_60;
  
  pFVar3 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar22 = &pFVar3[funcid].expr;
  local_108 = (color *)funcid;
  bVar9 = Expr::is_null(pEVar22);
  if ((!bVar9) &&
     ((local_118 = pFVar3 + funcid,
      ((local_118->expr).ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start)->opcode != 1 || (local_118->type != 0x10)))) {
    color::color::color(&local_60,&local_118->line_color);
    *local_60.a = 0.25;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d0,(long)(this->view).swid + 2,(allocator_type *)local_100);
    local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_88,(long)(this->view).swid + 2,(bool *)local_100,(allocator_type *)&local_138)
    ;
    local_138.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __args = extraout_RDX;
    if (plot_implicit(unsigned_long)::HIGH_PIX_LIMIT == '\0') {
      plot_implicit();
      __args = extraout_RDX_07;
    }
    iVar19 = (this->view).shigh;
    if (-4 < iVar19) {
      local_110 = &this->view;
      local_a0 = &this->env;
      local_b8 = &this->draw_buf;
      local_b0 = 0x800000000000003f;
      local_a8 = 0x8000000000000000;
      _Var26._M_head_impl = 0xffffffff;
      local_158 = pEVar22;
      do {
        __args = (anon_class_48_6_f4d7eaea_for__M_head_impl *)0x4;
        if (iVar19 <= _Var26._M_head_impl) {
          _Var26._M_head_impl = iVar19 - 1;
          uVar15 = iVar19 + 2;
          if (-1 < _Var26._M_head_impl) {
            uVar15 = _Var26._M_head_impl;
          }
          uVar15 = _Var26._M_head_impl - (uVar15 & 0xfffffffc);
          __args = (anon_class_48_6_f4d7eaea_for__M_head_impl *)(ulong)uVar15;
          if (uVar15 == 0) break;
        }
        iVar16 = (this->view).swid;
        if (-4 < iVar16) {
          local_98 = (this->view).ymin;
          local_98 = (((this->view).ymax - local_98) * (double)(iVar19 - _Var26._M_head_impl)) /
                     (double)iVar19 + local_98;
          local_140 = (int)__args;
          local_13c = local_140 + -1;
          local_144 = (float)(1 - local_140) + (float)_Var26._M_head_impl;
          local_148 = (float)local_140;
          local_140 = _Var26._M_head_impl - local_140;
          _Var25._M_head_impl = 0xffffffff;
          bVar9 = false;
          do {
            iVar19 = 4;
            if (iVar16 <= _Var25._M_head_impl) {
              _Var25._M_head_impl = iVar16 - 1;
              uVar15 = iVar16 + 2;
              if (-1 < _Var25._M_head_impl) {
                uVar15 = _Var25._M_head_impl;
              }
              iVar19 = _Var25._M_head_impl - (uVar15 & 0xfffffffc);
              if (iVar19 == 0) break;
            }
            dVar1 = (this->view).xmax;
            dVar2 = (this->view).xmin;
            pdVar4 = (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[this->y_var] = local_98;
            pdVar4[this->x_var] =
                 ((dVar1 - dVar2) * (double)_Var25._M_head_impl) / (double)iVar16 + dVar2;
            _Var6._M_head_impl = Expr::operator()(pEVar22,local_a0);
            pEVar21 = local_158;
            uVar27 = SUB84(_Var6._M_head_impl,0);
            uVar28 = (undefined4)((ulong)_Var6._M_head_impl >> 0x20);
            __args = extraout_RDX_00;
            if ((iVar19 + -1 <= _Var25._M_head_impl) && (local_13c <= _Var26._M_head_impl)) {
              uVar15 = -(uint)(_Var6._M_head_impl != 0.0) & 1;
              if (_Var6._M_head_impl < 0.0) {
                uVar15 = 0xffffffff;
              }
              iVar24 = _Var25._M_head_impl + 1;
              uVar14 = (ulong)iVar24;
              iVar16 = _Var25._M_head_impl + 0x40;
              if (-1 < iVar24) {
                iVar16 = iVar24;
              }
              iVar16 = iVar16 >> 6;
              uVar10 = (ulong)((uVar14 & local_b0) <= local_a8);
              __args = (anon_class_48_6_f4d7eaea_for__M_head_impl *)(1L << ((byte)iVar24 & 0x3f));
              uVar23 = local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)iVar16 + (uVar10 - 1)];
              local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[(long)iVar16 + (uVar10 - 1)] =
                   uVar23 & ~(1L << (uVar14 & 0x3f));
              uVar20 = -(uint)(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar24 - iVar19] != 0.0) & 1;
              if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24 - iVar19] < 0.0) {
                uVar20 = 0xffffffff;
              }
              rel_func = uVar10;
              if ((int)(uVar20 * uVar15) < 1) {
                rel_func = uVar10 * 8 - 8;
                local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[(long)iVar16 + (uVar10 - 1)] =
                     uVar23 | (ulong)__args;
              }
              uVar13 = -(uint)(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar14] != 0.0) & 1;
              if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14] < 0.0) {
                uVar13 = 0xffffffff;
              }
              bVar5 = (int)(uVar13 * uVar15) < 1;
              if (((uVar23 & (ulong)__args) != 0) ||
                 (((int)(uVar20 * uVar15) < 1 || bVar5) || bVar9)) {
                local_f8 = (atomic<int> *)CONCAT44(_Var25._M_head_impl - iVar19,_Var25._M_head_impl)
                ;
                local_f0 = (vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                            *)CONCAT44(local_140,_Var26._M_head_impl);
                local_150 = _Var6._M_head_impl;
                local_100 = (undefined1  [8])_Var6._M_head_impl;
                std::
                vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
                ::emplace_back<std::tuple<int,int,int,int,double>>
                          ((vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
                            *)&local_138,(tuple<int,_int,_int,_int,_double> *)local_100);
                __args = extraout_RDX_02;
                pEVar21 = local_158;
                bVar9 = bVar5;
LAB_0014152c:
                uVar27 = SUB84(local_150,0);
                uVar28 = (undefined4)((ulong)local_150 >> 0x20);
                pEVar22 = pEVar21;
              }
              else {
                pEVar22 = local_158;
                if (_Var6._M_head_impl < 0.0) {
                  bVar9 = false;
                }
                else {
                  if (local_118->type != 0x10) {
                    local_150 = _Var6._M_head_impl;
                    anon_unknown_1::buf_add_screen_rectangle
                              (local_b8,local_110,(float)(1 - iVar19) + (float)_Var25._M_head_impl,
                               local_144,(float)iVar19,local_148,SUB81(&local_60,0),local_108,
                               in_XMM4_Da,rel_func);
                    __args = extraout_RDX_01;
                    bVar9 = false;
                    goto LAB_0014152c;
                  }
                  bVar9 = false;
                }
              }
            }
            iVar19 = _Var25._M_head_impl + 1;
            local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)_Var25._M_head_impl + 1] =
                 (double)CONCAT44(uVar28,uVar27);
            _Var25._M_head_impl = _Var25._M_head_impl + 4;
            iVar16 = local_110->swid;
          } while (iVar19 < iVar16);
          iVar19 = (this->view).shigh;
        }
        iVar16 = _Var26._M_head_impl + 1;
        _Var26._M_head_impl = _Var26._M_head_impl + 4;
      } while (iVar16 < iVar19);
    }
    local_f8 = &local_8c;
    local_8c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    local_f0 = &local_138;
    local_e8 = local_118;
    local_e0 = &local_108;
    local_d8 = &local_60;
    local_100 = (undefined1  [8])this;
    if ((anonymous_namespace)::NUM_THREADS < 2) {
      std::
      _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sxyu[P]nivalis/src/plotter/render.cpp:640:19),_false>
      ::anon_class_48_6_f4d7eaea_for__M_head_impl::operator()
                ((anon_class_48_6_f4d7eaea_for__M_head_impl *)local_100);
    }
    else {
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar14 = 0;
      do {
        ptVar8 = local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar7 = local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar17 = (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          uVar10 = uVar17 + (uVar17 == 0);
          uVar23 = uVar10 + uVar17;
          if (0xffffffffffffffe < uVar23) {
            uVar23 = 0xfffffffffffffff;
          }
          if (CARRY8(uVar10,uVar17)) {
            uVar23 = 0xfffffffffffffff;
          }
          if (uVar23 == 0) {
            paVar11 = (allocator_type *)0x0;
          }
          else {
            paVar11 = (allocator_type *)
                      __gnu_cxx::new_allocator<std::thread>::allocate
                                ((new_allocator<std::thread> *)&local_178,uVar23,(void *)0x0);
            __args = extraout_RDX_04;
          }
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                    (paVar11 + uVar17 * 8,(thread *)local_100,__args);
          paVar18 = paVar11;
          for (paVar12 = (allocator_type *)ptVar7; paVar12 != (allocator_type *)ptVar8;
              paVar12 = paVar12 + 8) {
            *(native_handle_type *)paVar18 = (native_handle_type)*(id *)paVar12;
            *(id *)paVar12 = (id)0x0;
            paVar18 = paVar18 + 8;
          }
          __args = extraout_RDX_05;
          if ((allocator_type *)ptVar7 != (allocator_type *)0x0) {
            operator_delete(ptVar7,(long)local_178.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)ptVar7);
            __args = extraout_RDX_06;
          }
          local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(paVar11 + uVar23 * 8);
          local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)paVar11;
        }
        else {
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                    ((allocator_type *)
                     local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_finish,(thread *)local_100,__args);
          __args = extraout_RDX_03;
          paVar18 = (allocator_type *)
                    local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(paVar18 + 8);
        uVar14 = uVar14 + 1;
      } while (uVar14 < (anonymous_namespace)::NUM_THREADS);
      if (local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar14 = 0;
        do {
          std::thread::join();
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)local_178.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_178.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_178);
    }
    if (local_138.
        super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Plotter::plot_implicit(size_t funcid) {
    auto& func = funcs[funcid];
    // Implicit function
    if (func.expr.is_null() ||
            (func.expr.ast[0].opcode == OpCode::val &&
             func.type == Function::FUNC_TYPE_IMPLICIT)) {
        // Either 0=0 or c=0 for some c, do not draw
        return;
    }

    // Inequality color
    color::color ineq_color = get_ineq_color(func.line_color);

    // Coarse interval
    static const int COARSE_INTERVAL = 4;

    // Function values in above line
    std::vector<double> coarse_line(view.swid + 2);

    // 'Interesting' squares from above line/to left
    // When a square is painted, need to paint neighbor
    // to below (if changes sign left)/
    // right (if changes sign above) as well
    std::vector<bool> coarse_below_interesting(view.swid + 2);
    bool coarse_right_interesting = false;

    // Interesting squares
    using Square = std::tuple<int, int, int, int, double>;
    std::vector<Square> interest_squares;

    // Increase interval per x pixels
    static const size_t HIGH_PIX_LIMIT =
        std::max<size_t>(200000 / NUM_THREADS, 20000);
    // Maximum number of pixels to draw (stops drawing)
    static const size_t MAX_PIXELS = 300000;
    // Epsilon for bisection
    static const double BISECTION_EPS = 1e-4;

    for (int csy = -1; csy < view.shigh + COARSE_INTERVAL - 1; csy += COARSE_INTERVAL) {
        int cyi = COARSE_INTERVAL;
        if (csy >= view.shigh) {
            csy = view.shigh - 1;
            cyi = (view.shigh-1) % COARSE_INTERVAL;
            if (cyi == 0) break;
        }
        const double cy = _SY_TO_Y(csy);
        coarse_right_interesting = false;
        for (int csx = -1; csx < view.swid + COARSE_INTERVAL - 1; csx += COARSE_INTERVAL) {
            int cxi = COARSE_INTERVAL;
            if (csx >= view.swid) {
                csx = view.swid - 1;
                cxi = (view.swid-1) % COARSE_INTERVAL;
                if (cxi == 0) break;
            }
            // Update interval based on point count
            const double coarse_x = _SX_TO_X(csx);
            double precise_x = coarse_x, precise_y = cy;
            const int xy_pos = csy * view.swid + csx;

            env.vars[y_var] = cy;
            env.vars[x_var] = coarse_x;
            double z = func.expr(env);
            if (csx >= cxi-1 && csy >= cyi-1) {
                bool interesting_square = false;
                int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                bool interest_from_left = coarse_right_interesting;
                bool interest_from_above = coarse_below_interesting[csx+1];
                coarse_right_interesting = coarse_below_interesting[csx+1] = false;
                double zleft = coarse_line[csx+1 - cxi];
                int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                if (sgn_zleft * sgn_z <= 0) {
                    coarse_below_interesting[csx+1] = true;
                    interesting_square = true;
                }
                double zup = coarse_line[csx+1];
                int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                if (sgn_zup * sgn_z <= 0) {
                    coarse_right_interesting = true;
                    interesting_square = true;
                }
                if (interesting_square || interest_from_left ||
                        interest_from_above) {
                    interest_squares.push_back(Square(
                                csy - cyi, csy, csx - cxi, csx, z));
                } else if (sgn_z >= 0 &&
                        func.type !=
                        Function::FUNC_TYPE_IMPLICIT) {
                    // Inequality region
                    buf_add_screen_rectangle(draw_buf, view,
                            csx + (float)(- cxi + 1),
                            csy + (float)(- cyi + 1),
                            (float)cxi, (float)cyi,
                            true, ineq_color, 0.0, funcid);
                }
            }
            coarse_line[csx+1] = z;
        }
    }

#ifndef NIVALIS_EMSCRIPTEN
    std::atomic<int> sqr_id(0);
#else
    int sqr_id(0);
#endif
    auto worker = [&]() {
        std::vector<double> line(view.swid + 2);
        std::vector<bool> fine_paint_below(view.swid + 2);
        std::vector<std::array<int, 3> > tdraws, tdraws_ineq;
        std::vector<PointMarker> tpt_markers;
        Environment tenv = env;
        bool fine_paint_right;
        // Number of pixels drawn, used to increase fine interval
        size_t tpix_cnt = 0;
        // Fine interval (variable)
        int fine_interval = 1;
        while (true) {
            int i = sqr_id++;
            if (i >= interest_squares.size()) break;
            auto& sqr = interest_squares[i];

            if (tpix_cnt > MAX_PIXELS) break;
            // Update interval based on point count
            fine_interval = static_cast<int>(tpix_cnt /
                    HIGH_PIX_LIMIT) + 1;
            if (fine_interval >= 3) fine_interval = 4;

            int ylo, yhi, xlo, xhi; double z_at_xy_hi;
            std::tie(ylo, yhi, xlo, xhi, z_at_xy_hi) = sqr;

            std::fill(fine_paint_below.begin() + (xlo + 1),
                    fine_paint_below.begin() + (xhi + 2), false);
            for (int sy = ylo; sy <= yhi; sy += fine_interval) {
                fine_paint_right = false;
                const double y = _SY_TO_Y(sy);
                for (int sx = xlo; sx <= xhi; sx += fine_interval) {

                    const double x = _SX_TO_X(sx);
                    double z;
                    if (sy == yhi && sx == xhi) {
                        z = z_at_xy_hi;
                    } else {
                        tenv.vars[y_var] = y;
                        tenv.vars[x_var] = x;
                        z = func.expr(tenv);
                    }
                    if (sy > ylo && sx > xlo) {
                        int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                        bool paint_square = false;
                        bool paint_from_left = fine_paint_right;
                        bool paint_from_above = fine_paint_below[sx+1];
                        fine_paint_right = fine_paint_below[sx+1] = false;
                        double zup = line[sx+1];
                        int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                        if (sgn_zup * sgn_z <= 0) {
                            //     // Bisect up
                            //     tenv.vars[x_var] = x;
                            //     double lo = y;
                            //     double hi = (view.shigh - (sy - fine_interval))*1. / view.shigh * ydiff + view.ymin;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[y_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_z == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_y = lo;
                            paint_square = fine_paint_right = true;
                        }
                        double zleft = line[sx+1 - fine_interval];
                        int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                        if (sgn_zleft * sgn_z <= 0) {
                            // if (!paint_square) {
                            //     // Bisect left
                            //     tenv.vars[y_var] = y;
                            //     double lo = 1.*(sx - fine_interval) / view.swid * xdiff + view.xmin;
                            //     double hi = x;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[x_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_zleft == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_x = lo;
                            // }
                            paint_square = fine_paint_below[sx+1] = true;
                        }
                        if (paint_square || paint_from_left || paint_from_above) {
                            // float precise_sy =
                            //     static_cast<float>(
                            //             (view.ymax - y) / ydiff * view.shigh);
                            // float precise_sx = static_cast<float>(
                            //         (x - view.xmin) / xdiff * view.swid);
                            tdraws.push_back({sx, sy, fine_interval});
                            ++tpix_cnt;
                        } else if (sgn_z >= 0 &&
                                func.type !=
                                Function::FUNC_TYPE_IMPLICIT) {
                            // Inequality region
                            tdraws_ineq.push_back({sx, sy, fine_interval});
                        }
                    }
                    line[sx+1] = z;
                }
            }
        }

        {
#ifndef NIVALIS_EMSCRIPTEN
            std::lock_guard<std::mutex> lock(mtx);
#endif
            if ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                // Draw function line (boundary)
                for (auto& p : tdraws) {
                    buf_add_screen_rectangle(draw_buf, view,
                            p[0] + (float)(- p[2] + 1),
                            p[1] + (float)(- p[2] + 1),
                            (float)(p[2]),
                            (float)(p[2]),
                            true, func.line_color, 0.0, funcid);
                }
            }
            for (auto& p : tdraws_ineq) {
                // Draw inequality region
                buf_add_screen_rectangle(draw_buf, view,
                        p[0] + (float)(- p[2] + 1),
                        p[1] + (float)(- p[2] + 1),
                        (float)p[2],
                        (float)p[2],
                        true,
                        ineq_color, 0.0, funcid);
            }

            size_t sz = pt_markers.size();
            pt_markers.resize(sz + tpt_markers.size());
            std::move(tpt_markers.begin(), tpt_markers.end(),
                    pt_markers.begin() + sz);

            // Show detail lost warning
            if (fine_interval > 1) loss_detail = true;
        }
    };

#ifndef NIVALIS_EMSCRIPTEN
    if (NUM_THREADS <= 1) {
        worker();
    } else {
        std::vector<std::thread> pool;
        for (size_t i = 0; i < NUM_THREADS; ++i) {
            pool.emplace_back(worker);
        }
        for (size_t i = 0; i < pool.size(); ++i) pool[i].join();
    }
#else
    worker();
#endif
}